

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_ObjAddFanins(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vFanins)

{
  Mem_Flex_t *p_00;
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *__src;
  Vec_Int_t *vFanins_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if (pObj->nFanins != 0) {
    __assert_fail("pObj->nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                  ,0xf2,"void Wlc_ObjAddFanins(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Int_t *)");
  }
  uVar1 = Vec_IntSize(vFanins);
  pObj->nFanins = uVar1;
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) == (undefined1  [24])0x6)
  {
    pObj->nFanins = 0;
  }
  else if (((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x16) ||
          ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x35)) {
    pObj->nFanins = 1;
  }
  iVar2 = Wlc_ObjHasArray(pObj);
  if (iVar2 != 0) {
    p_00 = p->pMemFanin;
    iVar2 = Vec_IntSize(vFanins);
    piVar3 = (int *)Mem_FlexEntryFetch(p_00,iVar2 << 2);
    (pObj->field_10).pFanins[0] = piVar3;
  }
  piVar3 = Wlc_ObjFanins(pObj);
  __src = Vec_IntArray(vFanins);
  iVar2 = Vec_IntSize(vFanins);
  memcpy(piVar3,__src,(long)iVar2 << 2);
  return;
}

Assistant:

void Wlc_ObjAddFanins( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vFanins )
{
    assert( pObj->nFanins == 0 );
    pObj->nFanins = Vec_IntSize(vFanins);
    // special treatment of CONST, SELECT and TABLE
    if ( pObj->Type == WLC_OBJ_CONST )
        pObj->nFanins = 0;
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
        pObj->nFanins = 1;
    if ( Wlc_ObjHasArray(pObj) )
        pObj->pFanins[0] = (int *)Mem_FlexEntryFetch( p->pMemFanin, Vec_IntSize(vFanins) * sizeof(int) );
    memcpy( Wlc_ObjFanins(pObj), Vec_IntArray(vFanins), sizeof(int) * Vec_IntSize(vFanins) );
}